

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h__02_Reader.cpp
# Opt level: O0

AS02IndexReader * __thiscall
AS_02::MXF::AS02IndexReader::InitFromBuffer
          (AS02IndexReader *this,byte_t *p,ui32_t l,ui64_t *body_offset,
          ui64_t *essence_container_offset)

{
  Dictionary *pDVar1;
  int iVar2;
  KLVPacket *pKVar3;
  ui64_t uVar4;
  PacketList *pPVar5;
  ILogSink *pIVar6;
  undefined4 in_register_00000014;
  undefined8 *in_R9;
  long local_140;
  IndexTableSegment *segment;
  UL local_80;
  KLVPacket *local_60;
  InterchangeObject *object;
  byte_t *local_48;
  byte_t *end_p;
  undefined8 *local_38;
  ui64_t *essence_container_offset_local;
  ui64_t *body_offset_local;
  byte_t *pbStack_20;
  ui32_t l_local;
  byte_t *p_local;
  AS02IndexReader *this_local;
  Result_t *result;
  
  pbStack_20 = (byte_t *)CONCAT44(in_register_00000014,l);
  body_offset_local._4_4_ = (uint)body_offset;
  essence_container_offset_local = essence_container_offset;
  p_local = p;
  this_local = this;
  if (*(long *)(p + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/h__02_Reader.cpp"
                  ,0xff,
                  "ASDCP::Result_t AS_02::MXF::AS02IndexReader::InitFromBuffer(const byte_t *, ui32_t, const ui64_t &, const ui64_t &)"
                 );
  }
  end_p._7_1_ = 0;
  local_38 = in_R9;
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  local_48 = pbStack_20 + body_offset_local._4_4_;
  while( true ) {
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (iVar2 < 0 || local_48 <= pbStack_20) {
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (iVar2 < 0) {
        pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(pIVar6,"Failed to initialize AS02IndexReader.\n");
      }
      return this;
    }
    pDVar1 = *(Dictionary **)(p + 0x78);
    ASDCP::UL::UL(&local_80,pbStack_20);
    pKVar3 = (KLVPacket *)ASDCP::MXF::CreateObject(pDVar1,&local_80);
    ASDCP::UL::~UL(&local_80);
    local_60 = pKVar3;
    if (pKVar3 == (KLVPacket *)0x0) break;
    *(long *)(pKVar3 + 0x50) = *(long *)(p + 0x150);
    (**(code **)(*(long *)pKVar3 + 0x28))
              (&segment,pKVar3,pbStack_20,(int)local_48 - (int)pbStack_20);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&segment);
    Kumu::Result_t::~Result_t((Result_t *)&segment);
    uVar4 = ASDCP::KLVPacket::PacketLength(local_60);
    pbStack_20 = pbStack_20 + uVar4;
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (iVar2 < 0) {
      pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar6,"Error initializing index segment packet.\n");
      if (local_60 != (KLVPacket *)0x0) {
        (**(code **)(*(long *)local_60 + 8))();
      }
    }
    else {
      if (local_60 == (KLVPacket *)0x0) {
        local_140 = 0;
      }
      else {
        local_140 = __dynamic_cast(local_60,&ASDCP::MXF::InterchangeObject::typeinfo,
                                   &ASDCP::MXF::IndexTableSegment::typeinfo,0);
      }
      if (local_140 == 0) {
        if (local_60 != (KLVPacket *)0x0) {
          (**(code **)(*(long *)local_60 + 8))();
        }
      }
      else {
        *(undefined8 *)(local_140 + 0xa0) = *local_38;
        *(ui64_t *)(local_140 + 0xa8) = *essence_container_offset_local;
        pPVar5 = ASDCP::mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->
                           ((mem_ptr<ASDCP::MXF::Partition::PacketList> *)(p + 0x70));
        ASDCP::MXF::Partition::PacketList::AddPacket((InterchangeObject *)pPVar5);
      }
    }
  }
  __assert_fail("object",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/h__02_Reader.cpp"
                ,0x107,
                "ASDCP::Result_t AS_02::MXF::AS02IndexReader::InitFromBuffer(const byte_t *, ui32_t, const ui64_t &, const ui64_t &)"
               );
}

Assistant:

ASDCP::Result_t
AS_02::MXF::AS02IndexReader::InitFromBuffer(const byte_t* p, ui32_t l, const ui64_t& body_offset, const ui64_t& essence_container_offset)
{
  assert(m_Dict);
  Result_t result = RESULT_OK;
  const byte_t* end_p = p + l;

  while ( KM_SUCCESS(result) && p < end_p )
    {
      // parse the packets and index them by uid, discard KLVFill items
      InterchangeObject* object = CreateObject(m_Dict, p);
      assert(object);

      object->m_Lookup = m_Lookup;
      result = object->InitFromBuffer(p, end_p - p);
      p += object->PacketLength();

      if ( KM_SUCCESS(result) )
	{
	  IndexTableSegment *segment = dynamic_cast<IndexTableSegment*>(object);

	  if ( segment != 0 )
	    {
	      segment->RtFileOffset = essence_container_offset;
	      segment->RtEntryOffset = body_offset;
	      m_PacketList->AddPacket(object); // takes ownership
	    }
	  else
	    {
	      delete object;
	    }
	}
      else
	{
	  DefaultLogSink().Error("Error initializing index segment packet.\n");
	  delete object;
	}
    }

  if ( KM_FAILURE(result) )
    {
      DefaultLogSink().Error("Failed to initialize AS02IndexReader.\n");
    }

  return result;
}